

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matd.c
# Opt level: O1

matd_t * matd_identity(int dim)

{
  uint uVar1;
  matd_t *pmVar2;
  ulong uVar3;
  uint uVar4;
  
  if (dim == 0) {
    pmVar2 = (matd_t *)calloc(1,0x10);
    pmVar2->nrows = 0;
    pmVar2->ncols = 0;
    pmVar2[1].nrows = 0;
    pmVar2[1].ncols = 0x3ff00000;
  }
  else {
    uVar3 = (ulong)(uint)dim;
    pmVar2 = matd_create(dim,dim);
    if (0 < dim) {
      uVar1 = pmVar2->ncols;
      uVar4 = 0;
      do {
        pmVar2[(ulong)uVar4 + 1].nrows = 0;
        pmVar2[(ulong)uVar4 + 1].ncols = 0x3ff00000;
        uVar4 = uVar4 + uVar1 + 1;
        uVar3 = uVar3 - 1;
      } while (uVar3 != 0);
    }
  }
  return pmVar2;
}

Assistant:

matd_t *matd_identity(int dim)
{
    if (dim == 0)
        return matd_create_scalar(1);

    matd_t *m = matd_create(dim, dim);
    for (int i = 0; i < dim; i++)
        MATD_EL(m, i, i) = 1;

    return m;
}